

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

IsInstInlineCache * __thiscall Js::FunctionBody::GetIsInstInlineCache(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  void ***pppvVar5;
  undefined4 *puVar6;
  uchar **ppuVar7;
  uint index_local;
  FunctionBody *this_local;
  
  pppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  if (*pppvVar5 == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18f5,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = GetIsInstInlineCacheCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18f6,"(index < GetIsInstInlineCacheCount())",
                                "index < GetIsInstInlineCacheCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = GetInlineCacheCount(this);
  uVar4 = uVar3 + index;
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&this->m_inlineCacheTypes);
  if ((*ppuVar7)[uVar4] != '\0') {
    ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->m_inlineCacheTypes);
    if ((*ppuVar7)[uVar4] != '\x02') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x18fa,
                                  "(this->m_inlineCacheTypes[index] == 0x00 || this->m_inlineCacheTypes[index] == 0x02)"
                                  ,
                                  "this->m_inlineCacheTypes[index] == InlineCacheTypeNone || this->m_inlineCacheTypes[index] == InlineCacheTypeIsInst"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&this->m_inlineCacheTypes);
  (*ppuVar7)[uVar4] = '\x02';
  pppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  return (IsInstInlineCache *)(*pppvVar5)[uVar4];
}

Assistant:

IsInstInlineCache *FunctionBody::GetIsInstInlineCache(uint index)
    {
        Assert(this->inlineCaches != nullptr);
        Assert(index < GetIsInstInlineCacheCount());
        index += this->GetInlineCacheCount();
#if DBG
        Assert(this->m_inlineCacheTypes[index] == InlineCacheTypeNone ||
            this->m_inlineCacheTypes[index] == InlineCacheTypeIsInst);
        this->m_inlineCacheTypes[index] = InlineCacheTypeIsInst;
#endif
        return reinterpret_cast<IsInstInlineCache *>(this->inlineCaches[index]);
    }